

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

void __thiscall
duckdb::RowGroup::TemplatedScan<(duckdb::TableScanType)0>
          (RowGroup *this,TransactionData transaction,CollectionScanState *state,DataChunk *result)

{
  double *pdVar1;
  TableScanState *pTVar2;
  BlockManager *pBVar3;
  size_type __n;
  idx_t iVar4;
  _Head_base<0UL,_duckdb::ColumnScanState_*,_false> _Var5;
  data_ptr_t pdVar6;
  long lVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  FilterPropagateResult FVar11;
  int iVar12;
  const_reference pvVar13;
  ColumnData *pCVar14;
  reference pvVar15;
  const_reference pvVar16;
  reference pvVar17;
  ulong uVar18;
  const_iterator __begin5;
  ulong uVar19;
  pointer pSVar20;
  size_type __n_00;
  idx_t iVar21;
  ulong uVar22;
  long lVar23;
  size_type sVar24;
  pointer pSVar25;
  ulong uVar26;
  idx_t approved_tuple_count;
  optional_ptr<duckdb::AdaptiveFilter,_true> adaptive_filter;
  PrefetchState prefetch_state;
  idx_t local_138;
  RowGroup *local_130;
  DataChunk *local_128;
  idx_t local_120;
  undefined8 local_118;
  idx_t local_110;
  CollectionScanState *local_108;
  vector<duckdb::StorageIndex,_true> *local_100;
  SelectionVector local_f8;
  ScanFilterInfo *local_e0;
  SelectionVector *local_d8;
  type local_d0;
  _Head_base<0UL,_duckdb::AdaptiveFilter_*,_false> local_c8;
  buffer_ptr<SelectionData> *local_c0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b8;
  RandomEngine *local_b0;
  idx_t local_a8;
  vector<duckdb::ScanFilter,_true> *local_a0;
  UnifiedVectorFormat local_98;
  DuckTransaction *local_48;
  data_ptr_t pdStack_40;
  transaction_t local_38;
  
  pTVar2 = state->parent;
  local_100 = &pTVar2->column_ids;
  local_e0 = &pTVar2->filters;
  local_b0 = &state->random;
  local_d8 = &state->valid_sel;
  local_a0 = &(pTVar2->filters).filter_list;
  local_c0 = &(state->valid_sel).selection_data;
  local_a8 = 0xffffffffffffffff;
  local_130 = this;
  local_128 = result;
  local_108 = state;
  do {
    uVar26 = state->vector_index * 0x800;
    uVar19 = state->max_row_group_row + state->vector_index * -0x800;
    if (state->max_row_group_row < uVar26 || uVar19 == 0) {
      return;
    }
    if (0x7ff < uVar19) {
      uVar19 = 0x800;
    }
    if (((state->parent->sampling_info).do_system_sample != true) ||
       (dVar8 = RandomEngine::NextRandom(local_b0),
       pdVar1 = &(state->parent->sampling_info).sample_rate, dVar8 < *pdVar1 || dVar8 == *pdVar1)) {
      local_120 = uVar19;
      bVar10 = CheckZonemapSegments(local_130,state);
      bVar9 = true;
      if (bVar10) {
        local_110 = GetSelVector(state->row_group,transaction,state->vector_index,local_d8,local_120
                                );
        if (local_110 == 0) goto LAB_01104ac8;
        pBVar3 = ((local_130->collection)._M_data)->block_manager;
        iVar12 = (*pBVar3->_vptr_BlockManager[0x12])(pBVar3);
        if ((char)iVar12 != '\0') {
          local_98.sel = (SelectionVector *)0x0;
          local_98.data = (data_ptr_t)0x0;
          local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          if ((pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar23 = 0;
            sVar24 = 0;
            do {
              pvVar13 = vector<duckdb::StorageIndex,_true>::operator[](local_100,sVar24);
              if (pvVar13->index != 0xffffffffffffffff) {
                pCVar14 = GetColumn(local_130,pvVar13->index);
                (*pCVar14->_vptr_ColumnData[6])
                          (pCVar14,&local_98,
                           (long)&((state->column_scans).
                                   super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                   .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                  _M_head_impl)->current + lVar23,local_120);
              }
              sVar24 = sVar24 + 1;
              lVar23 = lVar23 + 0x98;
            } while (sVar24 < (ulong)((long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          (*pBVar3->buffer_manager->_vptr_BufferManager[8])(pBVar3->buffer_manager,&local_98);
          PrefetchState::~PrefetchState((PrefetchState *)&local_98);
        }
        if ((local_e0->table_filters).ptr == (TableFilterSet *)0x0) {
          local_118 = (ulong)local_118._4_4_ << 0x20;
        }
        else {
          uVar19 = ((long)(pTVar2->filters).filter_list.
                          super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                          super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pTVar2->filters).filter_list.
                          super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                          super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          local_118 = CONCAT44(local_118._4_4_,
                               (int)CONCAT71((int7)(uVar19 >> 8),
                                             (pTVar2->filters).always_true_filters < uVar19));
        }
        if ((local_110 == local_120) && ((char)local_118 == '\0')) {
          if ((pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              (pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            local_110 = local_120;
          }
          else {
            lVar23 = 0;
            sVar24 = 0;
            do {
              pvVar13 = vector<duckdb::StorageIndex,_true>::operator[](local_100,sVar24);
              if (pvVar13->index == 0xffffffffffffffff) {
                pvVar17 = vector<duckdb::Vector,_true>::operator[](&local_128->data,sVar24);
                Vector::Sequence(pvVar17,(local_130->super_SegmentBase<duckdb::RowGroup>).start +
                                         uVar26,1,local_120);
              }
              else {
                pCVar14 = GetColumn(local_130,pvVar13->index);
                local_118 = state->vector_index;
                _Var5._M_head_impl =
                     (state->column_scans).
                     super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                     .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
                pvVar17 = vector<duckdb::Vector,_true>::operator[](&local_128->data,sVar24);
                local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)transaction.start_time;
                uVar19 = (pCVar14->count).super___atomic_base<unsigned_long>._M_i +
                         local_118 * -0x800;
                if (0x7ff < uVar19) {
                  uVar19 = 0x800;
                }
                local_98.sel = (SelectionVector *)transaction.transaction.ptr.ptr;
                local_98.data = (data_ptr_t)transaction.transaction_id;
                (*pCVar14->_vptr_ColumnData[9])
                          (pCVar14,local_118,(long)&(_Var5._M_head_impl)->current + lVar23,pvVar17,
                           uVar19,pCVar14->_vptr_ColumnData,transaction.transaction.ptr._0_4_,
                           (undefined4)transaction.transaction_id,transaction.start_time);
              }
              sVar24 = sVar24 + 1;
              lVar23 = lVar23 + 0x98;
            } while (sVar24 < (ulong)((long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
            local_110 = local_120;
          }
LAB_01105228:
          local_128->count = local_110;
          state->vector_index = state->vector_index + 1;
          return;
        }
        local_138 = local_110;
        local_f8.sel_vector = (sel_t *)0x0;
        local_f8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_f8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (local_110 == local_120) {
          local_f8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_f8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_f8.sel_vector = (sel_t *)0x0;
        }
        else {
          shared_ptr<duckdb::SelectionData,_true>::operator=(&local_f8.selection_data,local_c0);
          local_f8.sel_vector = local_d8->sel_vector;
        }
        local_c8._M_head_impl =
             (pTVar2->filters).adaptive_filter.
             super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>
             .super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl;
        local_b8.__d.__r = (duration)ScanFilterInfo::BeginFilter(local_e0);
        if ((char)local_118 != '\0') {
          pSVar20 = (pTVar2->filters).filter_list.
                    super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                    super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar25 = (pTVar2->filters).filter_list.
                    super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                    super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (pSVar25 != pSVar20) {
            __n_00 = 0;
            do {
              optional_ptr<duckdb::AdaptiveFilter,_true>::CheckValid
                        ((optional_ptr<duckdb::AdaptiveFilter,_true> *)&local_c8);
              pvVar15 = vector<unsigned_long,_true>::operator[]
                                  (&(local_c8._M_head_impl)->permutation,__n_00);
              pvVar16 = vector<duckdb::ScanFilter,_true>::operator[](local_a0,*pvVar15);
              if (pvVar16->always_true == false) {
                local_d0 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                           ::operator*(&pvVar16->filter_state);
                __n = pvVar16->scan_column_index;
                iVar21 = pvVar16->table_column_index;
                pvVar17 = vector<duckdb::Vector,_true>::operator[](&local_128->data,__n);
                if (iVar21 == local_a8) {
                  iVar21 = (local_130->super_SegmentBase<duckdb::RowGroup>).start + uVar26;
                  FVar11 = CheckRowIdFilter(pvVar16->filter,iVar21,iVar21 + local_120);
                  state = local_108;
                  if (FVar11 == FILTER_ALWAYS_FALSE) {
                    local_138 = 0;
                  }
                  else {
                    Vector::SetVectorType(pvVar17,FLAT_VECTOR);
                    if (local_138 != 0) {
                      pdVar6 = pvVar17->data;
                      uVar19 = 0;
                      do {
                        uVar18 = uVar19;
                        if (local_f8.sel_vector != (sel_t *)0x0) {
                          uVar18 = (ulong)local_f8.sel_vector[uVar19];
                        }
                        *(idx_t *)(pdVar6 + uVar18 * 8) =
                             (local_130->super_SegmentBase<duckdb::RowGroup>).start + uVar26 +
                             uVar18;
                        uVar19 = uVar19 + 1;
                      } while (uVar19 < local_138);
                    }
                    if (FVar11 != FILTER_ALWAYS_TRUE) {
                      UnifiedVectorFormat::UnifiedVectorFormat(&local_98);
                      Vector::ToUnifiedFormat(pvVar17,local_138,&local_98);
                      ColumnSegment::FilterSelection
                                (&local_f8,pvVar17,&local_98,pvVar16->filter,local_d0,local_138,
                                 &local_138);
                      if (local_98.owned_sel.selection_data.internal.
                          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  (local_98.owned_sel.selection_data.internal.
                                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
                      }
                      if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data
                          .internal.
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  (local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                                   validity_data.internal.
                                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
                      }
                    }
                  }
                }
                else {
                  pCVar14 = GetColumn(local_130,pvVar16->table_column_index);
                  state = local_108;
                  (*pCVar14->_vptr_ColumnData[0xd])
                            (pCVar14,local_108->vector_index,
                             (local_108->column_scans).
                             super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                             .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl +
                             __n,pvVar17,&local_f8,&local_138,transaction.transaction.ptr._0_4_,
                             (undefined4)transaction.transaction_id,transaction.start_time,
                             pvVar16->filter,local_d0);
                }
              }
              __n_00 = __n_00 + 1;
              pSVar20 = (pTVar2->filters).filter_list.
                        super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                        super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pSVar25 = (pTVar2->filters).filter_list.
                        super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                        super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            } while (__n_00 < (ulong)(((long)pSVar25 - (long)pSVar20 >> 3) * -0x3333333333333333));
          }
          for (; pSVar20 != pSVar25; pSVar20 = pSVar20 + 1) {
            if (pSVar20->always_true == false) {
              pvVar17 = vector<duckdb::Vector,_true>::operator[]
                                  (&local_128->data,pSVar20->scan_column_index);
              Vector::Slice(pvVar17,&local_f8,local_138);
            }
          }
        }
        iVar21 = local_138;
        if (local_138 == 0) {
          DataChunk::Reset(local_128);
          if ((pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar23 = 0;
            uVar19 = 0;
            do {
              pvVar13 = vector<duckdb::StorageIndex,_true>::operator[](local_100,uVar19);
              if (pvVar13->index != 0xffffffffffffffff) {
                if (((char)local_118 != '\0') &&
                   (lVar7 = (long)(pTVar2->filters).column_has_filter.
                                  super_vector<bool,_std::allocator<bool>_>.
                                  super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                   uVar19 < (ulong)(pTVar2->filters).column_has_filter.
                                   super_vector<bool,_std::allocator<bool>_>.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                   _M_offset +
                            ((long)(pTVar2->filters).column_has_filter.
                                   super_vector<bool,_std::allocator<bool>_>.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                            - lVar7) * 8)) {
                  uVar26 = uVar19 + 0x3f;
                  if (-1 < (long)uVar19) {
                    uVar26 = uVar19;
                  }
                  if ((*(ulong *)(lVar7 + ((long)uVar26 >> 6) * 8 + -8 +
                                 (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                       (uVar19 & 0x3f) & 1) != 0) goto LAB_0110509a;
                }
                pCVar14 = GetColumn(local_130,pvVar13->index);
                (*pCVar14->_vptr_ColumnData[0x10])
                          (pCVar14,(long)&((state->column_scans).
                                           super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                           ._M_t.
                                           super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                           .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                          _M_head_impl)->current + lVar23,0x800);
              }
LAB_0110509a:
              uVar19 = uVar19 + 1;
              lVar23 = lVar23 + 0x98;
            } while (uVar19 < (ulong)((long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          state->vector_index = state->vector_index + 1;
          bVar9 = true;
        }
        else {
          if ((pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            uVar19 = 0;
            do {
              if (((char)local_118 == '\0') ||
                 (lVar23 = (long)(pTVar2->filters).column_has_filter.
                                 super_vector<bool,_std::allocator<bool>_>.
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                 (ulong)(pTVar2->filters).column_has_filter.
                        super_vector<bool,_std::allocator<bool>_>.
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                        _M_finish.super__Bit_iterator_base._M_offset +
                 ((long)(pTVar2->filters).column_has_filter.
                        super_vector<bool,_std::allocator<bool>_>.
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                        _M_finish.super__Bit_iterator_base._M_p - lVar23) * 8 <= uVar19)) {
LAB_01104e7e:
                pvVar13 = vector<duckdb::StorageIndex,_true>::operator[](local_100,uVar19);
                if (pvVar13->index == 0xffffffffffffffff) {
                  pvVar17 = vector<duckdb::Vector,_true>::operator[](&local_128->data,uVar19);
                  Vector::SetVectorType(pvVar17,FLAT_VECTOR);
                  pvVar17 = vector<duckdb::Vector,_true>::operator[](&local_128->data,uVar19);
                  if (local_138 != 0) {
                    pdVar6 = pvVar17->data;
                    uVar18 = 0;
                    do {
                      uVar22 = uVar18;
                      if (local_f8.sel_vector != (sel_t *)0x0) {
                        uVar22 = (ulong)local_f8.sel_vector[uVar18];
                      }
                      *(idx_t *)(pdVar6 + uVar18 * 8) =
                           (local_130->super_SegmentBase<duckdb::RowGroup>).start + uVar26 + uVar22;
                      uVar18 = uVar18 + 1;
                    } while (uVar18 < local_138);
                  }
                }
                else {
                  pCVar14 = GetColumn(local_130,pvVar13->index);
                  local_38 = transaction.start_time;
                  iVar4 = local_108->vector_index;
                  _Var5._M_head_impl =
                       (local_108->column_scans).
                       super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                       .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
                  local_48 = transaction.transaction.ptr.ptr;
                  pdStack_40 = (data_ptr_t)transaction.transaction_id;
                  pvVar17 = vector<duckdb::Vector,_true>::operator[](&local_128->data,uVar19);
                  (*pCVar14->_vptr_ColumnData[0xe])
                            (pCVar14,iVar4,_Var5._M_head_impl + uVar19,pvVar17,&local_f8,local_138,
                             local_48._0_4_,pdStack_40._0_4_,local_38);
                }
              }
              else {
                uVar18 = uVar19 + 0x3f;
                if (-1 < (long)uVar19) {
                  uVar18 = uVar19;
                }
                if ((*(ulong *)(lVar23 + ((long)uVar18 >> 6) * 8 + -8 +
                               (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                     (uVar19 & 0x3f) & 1) == 0) goto LAB_01104e7e;
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 < (ulong)((long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          ScanFilterInfo::EndFilter(local_e0,(AdaptiveFilterState)local_b8.__d.__r);
          bVar9 = false;
          local_110 = local_138;
          state = local_108;
        }
        if (local_f8.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (iVar21 != 0) goto LAB_01105228;
      }
    }
    else {
LAB_01104ac8:
      NextVector(local_130,state);
      bVar9 = true;
    }
    if (!bVar9) {
      return;
    }
  } while( true );
}

Assistant:

void RowGroup::TemplatedScan(TransactionData transaction, CollectionScanState &state, DataChunk &result) {
	const bool ALLOW_UPDATES = TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_DISALLOW_UPDATES &&
	                           TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED;
	const auto &column_ids = state.GetColumnIds();
	auto &filter_info = state.GetFilterInfo();
	while (true) {
		if (state.vector_index * STANDARD_VECTOR_SIZE >= state.max_row_group_row) {
			// exceeded the amount of rows to scan
			return;
		}
		idx_t current_row = state.vector_index * STANDARD_VECTOR_SIZE;
		auto max_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, state.max_row_group_row - current_row);

		// check the sampling info if we have to sample this chunk
		if (state.GetSamplingInfo().do_system_sample &&
		    state.random.NextRandom() > state.GetSamplingInfo().sample_rate) {
			NextVector(state);
			continue;
		}

		//! first check the zonemap if we have to scan this partition
		if (!CheckZonemapSegments(state)) {
			continue;
		}

		// second, scan the version chunk manager to figure out which tuples to load for this transaction
		idx_t count;
		if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
			count = state.row_group->GetSelVector(transaction, state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else if (TYPE == TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED) {
			count = state.row_group->GetCommittedSelVector(transaction.start_time, transaction.transaction_id,
			                                               state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else {
			count = max_count;
		}
		auto &block_manager = GetBlockManager();
#ifndef DUCKDB_ALTERNATIVE_VERIFY
		// // in regular operation we only prefetch from remote file systems
		// // when alternative verify is set, we always prefetch for testing purposes
		if (block_manager.IsRemote())
#else
		if (!block_manager.InMemory())
#endif
		{
			PrefetchState prefetch_state;
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (!column.IsRowIdColumn()) {
					GetColumn(column).InitializePrefetch(prefetch_state, state.column_scans[i], max_count);
				}
			}
			auto &buffer_manager = block_manager.buffer_manager;
			buffer_manager.Prefetch(prefetch_state.blocks);
		}

		bool has_filters = filter_info.HasFilters();
		if (count == max_count && !has_filters) {
			// scan all vectors completely: full scan without deletions or table filters
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					// scan row id
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].Sequence(UnsafeNumericCast<int64_t>(this->start + current_row), 1, count);
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE != TableScanType::TABLE_SCAN_REGULAR) {
						col_data.ScanCommitted(state.vector_index, state.column_scans[i], result.data[i],
						                       ALLOW_UPDATES);
					} else {
						col_data.Scan(transaction, state.vector_index, state.column_scans[i], result.data[i]);
					}
				}
			}
		} else {
			// partial scan: we have deletions or table filters
			idx_t approved_tuple_count = count;
			SelectionVector sel;
			if (count != max_count) {
				sel.Initialize(state.valid_sel);
			} else {
				sel.Initialize(nullptr);
			}
			//! first, we scan the columns with filters, fetch their data and generate a selection vector.
			//! get runtime statistics
			auto adaptive_filter = filter_info.GetAdaptiveFilter();
			auto filter_state = filter_info.BeginFilter();
			if (has_filters) {
				D_ASSERT(ALLOW_UPDATES);
				auto &filter_list = filter_info.GetFilterList();
				for (idx_t i = 0; i < filter_list.size(); i++) {
					auto filter_idx = adaptive_filter->permutation[i];
					auto &filter = filter_list[filter_idx];
					if (filter.IsAlwaysTrue()) {
						// this filter is always true - skip it
						continue;
					}
					auto &table_filter_state = *filter.filter_state;

					const auto scan_idx = filter.scan_column_index;
					const auto column_idx = filter.table_column_index;

					auto &result_vector = result.data[scan_idx];
					if (column_idx == COLUMN_IDENTIFIER_ROW_ID) {
						// We do another quick statistics scan for row ids here
						const auto rowid_start = this->start + current_row;
						const auto rowid_end = this->start + current_row + max_count;
						const auto prune_result = CheckRowIdFilter(filter.filter, rowid_start, rowid_end);
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
							// We can just break out of the loop here.
							approved_tuple_count = 0;
							continue;
						}

						// Generate row ids
						// Create sequence for row ids
						D_ASSERT(result_vector.GetType().InternalType() == ROW_TYPE);
						result_vector.SetVectorType(VectorType::FLAT_VECTOR);
						auto result_data = FlatVector::GetData<int64_t>(result_vector);
						for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
							result_data[sel.get_index(sel_idx)] =
							    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
						}

						// Was this filter always true? If so, we dont need to apply it
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
							continue;
						}

						// Now apply the filter
						UnifiedVectorFormat vdata;
						result_vector.ToUnifiedFormat(approved_tuple_count, vdata);
						ColumnSegment::FilterSelection(sel, result_vector, vdata, filter.filter, table_filter_state,
						                               approved_tuple_count, approved_tuple_count);

					} else {
						auto &col_data = GetColumn(filter.table_column_index);
						col_data.Filter(transaction, state.vector_index, state.column_scans[scan_idx], result_vector,
						                sel, approved_tuple_count, filter.filter, table_filter_state);
					}
				}
				for (auto &table_filter : filter_list) {
					if (table_filter.IsAlwaysTrue()) {
						continue;
					}
					result.data[table_filter.scan_column_index].Slice(sel, approved_tuple_count);
				}
			}
			if (approved_tuple_count == 0) {
				// all rows were filtered out by the table filters
				D_ASSERT(has_filters);
				result.Reset();
				// skip this vector in all the scans that were not scanned yet
				for (idx_t i = 0; i < column_ids.size(); i++) {
					auto &col_idx = column_ids[i];
					if (col_idx.IsRowIdColumn()) {
						continue;
					}
					if (has_filters && filter_info.ColumnHasFilters(i)) {
						continue;
					}
					auto &col_data = GetColumn(col_idx);
					col_data.Skip(state.column_scans[i]);
				}
				state.vector_index++;
				continue;
			}
			//! Now we use the selection vector to fetch data for the other columns.
			for (idx_t i = 0; i < column_ids.size(); i++) {
				if (has_filters && filter_info.ColumnHasFilters(i)) {
					// column has already been scanned as part of the filtering process
					continue;
				}
				auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].SetVectorType(VectorType::FLAT_VECTOR);
					auto result_data = FlatVector::GetData<int64_t>(result.data[i]);
					for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
						result_data[sel_idx] =
						    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
					}
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
						col_data.Select(transaction, state.vector_index, state.column_scans[i], result.data[i], sel,
						                approved_tuple_count);
					} else {
						col_data.SelectCommitted(state.vector_index, state.column_scans[i], result.data[i], sel,
						                         approved_tuple_count, ALLOW_UPDATES);
					}
				}
			}
			filter_info.EndFilter(filter_state);

			D_ASSERT(approved_tuple_count > 0);
			count = approved_tuple_count;
		}
		result.SetCardinality(count);
		state.vector_index++;
		break;
	}
}